

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
      *this)

{
  value_type vVar1;
  double dVar2;
  
  vVar1 = FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::val(&this->left_->fadexpr_);
  dVar2 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar2 * vVar1;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}